

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

bool __thiscall wabt::interp::Store::HasValueType(Store *this,Ref ref,ValueType type)

{
  bool bVar1;
  Object **ppOVar2;
  Enum EVar3;
  
  bVar1 = IsValid(this,ref);
  if (bVar1) {
    EVar3 = type.enum_;
    if (ref.index == 0 || EVar3 == ExternRef) {
      return true;
    }
    ppOVar2 = FreeList<wabt::interp::Object_*>::Get(&this->objects_,ref.index);
    if (EVar3 == ExnRef) {
      return (*ppOVar2)->kind_ == Exception;
    }
    if (EVar3 == FuncRef) {
      return ((*ppOVar2)->kind_ & ~Foreign) == DefinedFunc;
    }
  }
  return false;
}

Assistant:

bool Store::HasValueType(Ref ref, ValueType type) const {
  // TODO opt?
  if (!IsValid(ref)) {
    return false;
  }
  if (type == ValueType::ExternRef) {
    return true;
  }
  if (ref == Ref::Null) {
    return true;
  }

  Object* obj = objects_.Get(ref.index);
  switch (type) {
    case ValueType::FuncRef:
      return obj->kind() == ObjectKind::DefinedFunc ||
             obj->kind() == ObjectKind::HostFunc;
    case ValueType::ExnRef:
      return obj->kind() == ObjectKind::Exception;
    default:
      return false;
  }
}